

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContextTlsEntry.cpp
# Opt level: O2

bool ThreadContextTLSEntry::InitializeProcess(void)

{
  return true;
}

Assistant:

bool ThreadContextTLSEntry::InitializeProcess()
{
#ifdef _WIN32
    Assert(s_tlsSlot == TLS_OUT_OF_INDEXES);
    s_tlsSlot = TlsAlloc();
    return (s_tlsSlot != TLS_OUT_OF_INDEXES);
#else
    return true;
#endif
}